

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  Nonnull<const_char_*> failure_msg;
  MessageLite *pMVar4;
  undefined4 extraout_var;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  anon_enum_32 local_3c;
  LogMessageFatal local_38;
  
  pVar5 = Insert(this,number);
  pEVar3 = pVar5.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_38.super_LogMessage.errno_saver_.saved_errno_ = pEVar3->is_repeated ^ CPPTYPE_INT32;
    local_3c = OPTIONAL_FIELD;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                            ((anon_enum_32 *)&local_38,&local_3c,
                             "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_38.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar3->type);
      local_3c = 10;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                              ((CppType *)&local_38,&local_3c,
                               "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        bVar1 = pEVar3->field_0xa;
        pEVar3->field_0xa = bVar1 & 0xfd;
        pMVar4 = (MessageLite *)(pEVar3->field_0).int64_t_value;
        if ((bVar1 & 4) == 0) {
          return pMVar4;
        }
        iVar2 = (*pMVar4->_vptr_MessageLite[5])(pMVar4,prototype,this->arena_);
        return (MessageLite *)CONCAT44(extraout_var,iVar2);
      }
    }
    iVar2 = 0x2a3;
  }
  else {
    pEVar3->type = type;
    local_38.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(type);
    local_3c = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_38,&local_3c,
                             "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pEVar3->is_repeated = false;
      pEVar3->field_0xa = (pEVar3->field_0xa & 0xfa) + 1;
      pMVar4 = MessageLite::New(prototype,this->arena_);
      (pEVar3->field_0).int64_t_value = (int64_t)pMVar4;
      pEVar3->field_0xa = pEVar3->field_0xa & 0xfd;
      return pMVar4;
    }
    iVar2 = 0x29b;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,iVar2,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->ptr.message_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->MutableMessage(prototype,
                                                              arena_);
    } else {
      return extension->ptr.message_value;
    }
  }
}